

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_image_crop_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_rec crop,void *dst,rf_int dst_size,
          rf_uncompressed_pixel_format dst_format)

{
  rf_source_location source_location;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined8 in_R9;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  float fVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar9 = crop._8_8_;
  fVar10 = crop.x;
  fVar15 = crop.y;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    if (fVar10 < 0.0) {
      uVar9 = CONCAT44(crop.height,fVar10 + crop.width);
      fVar10 = 0.0;
    }
    if (fVar15 < 0.0) {
      fVar13 = fVar15 + (float)((ulong)uVar9 >> 0x20);
      fVar15 = 0.0;
      uVar9 = CONCAT44(fVar13,(int)uVar9);
    }
    fVar13 = (float)image.width;
    if ((fVar10 < fVar13) && (fVar14 = (float)image.height, fVar15 < fVar14)) {
      if (fVar13 < fVar10 + (float)uVar9) {
        uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),fVar13 - fVar10);
      }
      if (fVar14 < (float)((ulong)uVar9 >> 0x20) + fVar15) {
        uVar9 = CONCAT44(fVar14 - fVar15,(int)uVar9);
      }
      iVar11 = (int)(float)uVar9;
      iVar12 = (int)(float)((ulong)uVar9 >> 0x20);
      iVar1 = rf_bits_per_pixel(dst_format);
      iVar2 = iVar1 * iVar11 * iVar12;
      iVar1 = iVar2 + 7;
      if (-1 < iVar2) {
        iVar1 = iVar2;
      }
      if (iVar1 >> 3 <= dst_size) {
        iVar1 = 0;
        if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
          iVar1 = *(int *)(&DAT_0017a7c8 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 4);
        }
        if (0 < iVar12) {
          iVar2 = ((int)fVar15 * image.width + (int)fVar10) * iVar1;
          iVar7 = 0;
          lVar3 = 0;
          do {
            lVar4 = (long)iVar11;
            iVar8 = iVar2;
            iVar6 = iVar7;
            if (0 < iVar11) {
              do {
                rf_format_one_pixel((void *)((long)image.data + (long)iVar8),image.format,
                                    (void *)((long)dst + (long)iVar6),dst_format);
                iVar6 = iVar6 + iVar1;
                iVar8 = iVar8 + iVar1;
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
            }
            lVar3 = lVar3 + 1;
            iVar7 = iVar7 + iVar11 * iVar1;
            iVar2 = iVar2 + image.width * iVar1;
          } while (lVar3 != iVar12);
        }
        __return_storage_ptr__->data = dst;
        __return_storage_ptr__->format = dst_format;
        __return_storage_ptr__->width = iVar11;
        __return_storage_ptr__->height = iVar12;
        __return_storage_ptr__->valid = true;
        return __return_storage_ptr__;
      }
      source_location.proc_name._0_4_ = 0x17b0fa;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x3dbb;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Destination buffer is too small. Expected at least %d bytes but was %d",1,
                  (ulong)(uint)(iVar1 >> 3),dst_size,in_R9);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_crop_to_buffer";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3dbb;
      goto LAB_0012801a;
    }
    uVar9 = 0x3dbd;
    pcVar5 = "Image can not be cropped, crop rectangle out of bounds.";
  }
  else {
    uVar9 = 0x3dbf;
    pcVar5 = "Image is invalid.";
  }
  rf_log_impl(8,(rf_log_type)pcVar5,(char *)0x1);
  *(char **)(in_FS_OFFSET + -0x450) =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  *(char **)(in_FS_OFFSET + -0x448) = "rf_image_crop_to_buffer";
  *(undefined8 *)(in_FS_OFFSET + -0x440) = uVar9;
LAB_0012801a:
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_crop_to_buffer(rf_image image, rf_rec crop, void* dst, rf_int dst_size, rf_uncompressed_pixel_format dst_format)
{
    rf_image result = {0};

    if (image.valid)
    {
        // Security checks to validate crop rectangle
        if (crop.x < 0) { crop.width += crop.x; crop.x = 0; }
        if (crop.y < 0) { crop.height += crop.y; crop.y = 0; }
        if ((crop.x + crop.width) > image.width) { crop.width = image.width - crop.x; }
        if ((crop.y + crop.height) > image.height) { crop.height = image.height - crop.y; }

        if ((crop.x < image.width) && (crop.y < image.height))
        {
            int expected_size = rf_pixel_buffer_size(crop.width, crop.height, dst_format);
            if (dst_size >= expected_size)
            {
                rf_pixel_format src_format = image.format;
                int src_size = rf_image_size(image);

                unsigned char* src_ptr = image.data;
                unsigned char* dst_ptr = dst;

                int src_bpp = rf_bytes_per_pixel(image.format);
                int dst_bpp = rf_bytes_per_pixel(dst_format);

                int crop_y = crop.y;
                int crop_h = crop.height;
                int crop_x = crop.x;
                int crop_w = crop.width;

                for (rf_int y = 0; y < crop_h; y++)
                {
                    for (rf_int x = 0; x < crop_w; x++)
                    {
                        int src_x = x + crop_x;
                        int src_y = y + crop_y;

                        int src_pixel = (src_y * image.width + src_x) * src_bpp;
                        int dst_pixel = (y * crop_w + x) * src_bpp;
                        RF_ASSERT(src_pixel < src_size);
                        RF_ASSERT(dst_pixel < dst_size);

                        rf_format_one_pixel(&src_ptr[src_pixel], src_format, &dst_ptr[dst_pixel], dst_format);
                    }
                }

                result.data   = dst;
                result.format = dst_format;
                result.width  = crop.width;
                result.height = crop.height;
                result.valid  = true;
            }
            else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Destination buffer is too small. Expected at least %d bytes but was %d", expected_size, dst_size);
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image can not be cropped, crop rectangle out of bounds.");
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}